

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,false>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong right;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  interval_t iVar9;
  interval_t left;
  interval_t left_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar6 = 0;
      iVar5 = count;
      do {
        iVar9.micros = *(int64_t *)((long)ldata + lVar6);
        iVar9._0_8_ = *(undefined8 *)((long)&rdata->micros + lVar6 * 2);
        iVar9 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                          (*(MultiplyOperator **)((long)&rdata->months + lVar6 * 2),iVar9,count);
        *(long *)((long)&result_data->months + lVar6 * 2) = iVar9._0_8_;
        *(int64_t *)((long)&result_data->micros + lVar6 * 2) = iVar9.micros;
        lVar6 = lVar6 + 8;
        iVar5 = iVar5 - 1;
      } while (iVar5 != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar2 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = 0xffffffffffffffff;
      }
      else {
        uVar3 = puVar1[uVar2];
      }
      uVar4 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar4 = count;
      }
      uVar7 = uVar4;
      if (uVar3 != 0) {
        uVar7 = uVar8;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar8 < uVar4) {
            lVar6 = uVar8 * 2 + 1;
            uVar3 = uVar2;
            do {
              left.micros = ldata[uVar8];
              left._0_8_ = *(undefined8 *)(&rdata->months + lVar6 * 2);
              iVar9 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                (*(MultiplyOperator **)((long)rdata + lVar6 * 8 + -8),left,uVar3);
              *(long *)((long)result_data + lVar6 * 8 + -8) = iVar9._0_8_;
              *(int64_t *)(&result_data->months + lVar6 * 2) = iVar9.micros;
              uVar8 = uVar8 + 1;
              lVar6 = lVar6 + 2;
              uVar7 = uVar8;
            } while (uVar4 != uVar8);
          }
        }
        else if (uVar8 < uVar4) {
          lVar6 = uVar8 * 2 + 1;
          uVar7 = 0;
          right = uVar2;
          do {
            if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
              left_00.micros = ldata[uVar8 + uVar7];
              left_00._0_8_ = *(undefined8 *)(&rdata->months + lVar6 * 2);
              iVar9 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                (*(MultiplyOperator **)((long)rdata + lVar6 * 8 + -8),left_00,right)
              ;
              *(long *)((long)result_data + lVar6 * 8 + -8) = iVar9._0_8_;
              *(int64_t *)(&result_data->months + lVar6 * 2) = iVar9.micros;
            }
            uVar7 = uVar7 + 1;
            lVar6 = lVar6 + 2;
          } while ((uVar8 - uVar4) + uVar7 != 0);
          uVar7 = uVar8 + uVar7;
        }
      }
      uVar2 = uVar2 + 1;
      uVar8 = uVar7;
    } while (uVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}